

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O1

Status __thiscall
flatbuffers::anon_unknown_25::CppCodeGenerator::GenerateCode
          (CppCodeGenerator *this,Parser *parser,string *path,string *filename)

{
  undefined4 *puVar1;
  long lVar2;
  Parser *pPVar3;
  bool bVar4;
  int iVar5;
  pointer __dest;
  Status SVar6;
  long lVar7;
  IDLOptionsCpp opts;
  CppGenerator generator;
  size_type __dnew;
  undefined4 *local_ce8;
  long local_ce0;
  undefined4 local_cd8;
  undefined1 uStack_cd4;
  undefined1 uStack_cd3;
  undefined2 uStack_cd2;
  IDLOptions local_cc8;
  byte local_9b8;
  undefined1 local_9b0 [1640];
  Parser *local_348 [97];
  uint local_3c;
  bool local_38;
  
  IDLOptions::IDLOptions(&local_cc8,&parser->opts);
  local_cc8._780_4_ = 1;
  local_9b8 = 1;
  local_ce8 = &local_cd8;
  if (local_cc8.cpp_std._M_string_length == 0) {
    uStack_cd4 = 0x31;
    local_cd8 = 0x312b2b43;
    local_ce0 = 5;
    uStack_cd3 = 0;
  }
  else {
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_ce8,local_cc8.cpp_std._M_dataplus._M_p,
               local_cc8.cpp_std._M_dataplus._M_p + local_cc8.cpp_std._M_string_length);
  }
  lVar2 = local_ce0;
  puVar1 = local_ce8;
  if (local_ce0 != 0) {
    lVar7 = 0;
    do {
      iVar5 = toupper((uint)*(byte *)((long)puVar1 + lVar7));
      *(char *)((long)puVar1 + lVar7) = (char)iVar5;
      lVar7 = lVar7 + 1;
    } while (lVar2 != lVar7);
  }
  iVar5 = std::__cxx11::string::compare((char *)&local_ce8);
  if (iVar5 == 0) {
    local_cc8._780_4_ = 0;
    local_9b8 = 0;
LAB_001656a7:
    local_9b8 = local_9b8 | local_cc8.scoped_enums;
    if ((local_cc8.cpp_static_reflection != true) || (1 < (uint)local_cc8._780_4_)) {
      IDLOptions::IDLOptions((IDLOptions *)local_348,&local_cc8);
      local_38 = (bool)local_9b8;
      local_3c = local_cc8._780_4_;
      cpp::CppGenerator::CppGenerator
                ((CppGenerator *)local_9b0,parser,path,filename,(IDLOptionsCpp *)local_348);
      IDLOptions::~IDLOptions((IDLOptions *)local_348);
      bVar4 = cpp::CppGenerator::generate((CppGenerator *)local_9b0);
      cpp::CppGenerator::~CppGenerator((CppGenerator *)local_9b0);
      SVar6 = (Status)!bVar4;
      goto LAB_001657d7;
    }
    local_348[0] = (Parser *)0x46;
    local_9b0._0_8_ = local_9b0 + 0x10;
    __dest = (pointer)std::__cxx11::string::_M_create((ulong *)local_9b0,(ulong)local_348);
    pPVar3 = local_348[0];
    local_9b0._16_8_ = local_348[0];
    local_9b0._0_8_ = __dest;
    memcpy(__dest,"--cpp-static-reflection requires using --cpp-std at \"C++17\" or higher.",0x46);
    local_9b0._8_8_ = pPVar3;
    __dest[(long)pPVar3] = '\0';
    LogCompilerError((string *)local_9b0);
    if ((undefined1 *)local_9b0._0_8_ != local_9b0 + 0x10) {
LAB_00165746:
      operator_delete((void *)local_9b0._0_8_,local_9b0._16_8_ + 1);
    }
  }
  else {
    iVar5 = std::__cxx11::string::compare((char *)&local_ce8);
    if (iVar5 == 0) {
      local_cc8._780_4_ = 1;
      local_9b8 = 1;
      goto LAB_001656a7;
    }
    iVar5 = std::__cxx11::string::compare((char *)&local_ce8);
    if (iVar5 == 0) {
      local_cc8._780_4_ = 2;
      local_cc8.prefixed_enums = false;
      local_cc8.scoped_enums = true;
      goto LAB_001656a7;
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_9b0,
                   "Unknown value of the \'--cpp-std\' switch: ",&local_cc8.cpp_std);
    LogCompilerError((string *)local_9b0);
    if ((undefined1 *)local_9b0._0_8_ != local_9b0 + 0x10) goto LAB_00165746;
  }
  SVar6 = ERROR;
LAB_001657d7:
  if (local_ce8 != &local_cd8) {
    operator_delete(local_ce8,
                    CONCAT26(uStack_cd2,CONCAT15(uStack_cd3,CONCAT14(uStack_cd4,local_cd8))) + 1);
  }
  IDLOptions::~IDLOptions(&local_cc8);
  return SVar6;
}

Assistant:

Status GenerateCode(const Parser &parser, const std::string &path,
                      const std::string &filename) override {
    if (!GenerateCPP(parser, path, filename)) { return Status::ERROR; }
    return Status::OK;
  }